

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O0

void __thiscall AddrManImpl::Connected_(AddrManImpl *this,CService *addr,NodeSeconds time)

{
  long lVar1;
  strong_ordering sVar2;
  bool bVar3;
  AddrInfo *__rhs;
  rep in_RDX;
  CService *in_RSI;
  AddrManImpl *in_RDI;
  long in_FS_OFFSET;
  AddrInfo *info;
  AddrInfo *pinfo;
  minutes update_interval;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  char *in_stack_ffffffffffffffb8;
  nid_type *in_stack_ffffffffffffffc0;
  AddrInfo *__lhs;
  AddrManImpl *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            (in_stack_ffffffffffffffb8,
             (char *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
             (int)((ulong)in_RDI >> 0x20),(AnnotatedMixin<std::mutex> *)0xee75a6);
  __rhs = Find(this_00,in_RSI,in_stack_ffffffffffffffc0);
  if (__rhs != (AddrInfo *)0x0) {
    __lhs = __rhs;
    std::chrono::operator-
              ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
               CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
               (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)in_RDI);
    sVar2 = std::chrono::operator<=><long,_std::ratio<1L,_1L>,_long,_std::ratio<60L,_1L>_>
                      ((duration<long,_std::ratio<1L,_1L>_> *)__lhs,
                       (duration<long,_std::ratio<60L,_1L>_> *)__rhs);
    std::__cmp_cat::__unspec::__unspec((__unspec *)in_RDI,(__unspec *)0xee7616);
    bVar3 = std::operator>(sVar2._M_value);
    if (bVar3) {
      (__rhs->super_CAddress).nTime.__d.__r = in_RDX;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void AddrManImpl::Connected_(const CService& addr, NodeSeconds time)
{
    AssertLockHeld(cs);

    AddrInfo* pinfo = Find(addr);

    // if not found, bail out
    if (!pinfo)
        return;

    AddrInfo& info = *pinfo;

    // update info
    const auto update_interval{20min};
    if (time - info.nTime > update_interval) {
        info.nTime = time;
    }
}